

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlElemDump(FILE *f,xmlDocPtr doc,xmlNodePtr cur)

{
  xmlOutputBufferPtr buf;
  xmlOutputBufferPtr outbuf;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  FILE *f_local;
  
  xmlInitParser();
  if ((cur != (xmlNodePtr)0x0) &&
     (buf = xmlOutputBufferCreateFile(f,(xmlCharEncodingHandlerPtr)0x0),
     buf != (xmlOutputBufferPtr)0x0)) {
    if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
      xmlNodeDumpOutput(buf,doc,cur,0,1,(char *)0x0);
    }
    else {
      htmlNodeDumpOutput(buf,doc,cur,(char *)0x0);
    }
    xmlOutputBufferClose(buf);
  }
  return;
}

Assistant:

void
xmlElemDump(FILE * f, xmlDocPtr doc, xmlNodePtr cur)
{
    xmlOutputBufferPtr outbuf;

    xmlInitParser();

    if (cur == NULL) {
        return;
    }

    outbuf = xmlOutputBufferCreateFile(f, NULL);
    if (outbuf == NULL)
        return;
#ifdef LIBXML_HTML_ENABLED
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE))
        htmlNodeDumpOutput(outbuf, doc, cur, NULL);
    else
#endif /* LIBXML_HTML_ENABLED */
        xmlNodeDumpOutput(outbuf, doc, cur, 0, 1, NULL);
    xmlOutputBufferClose(outbuf);
}